

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O2

void testQueue(void)

{
  uint32_t uVar1;
  ostream *poVar2;
  int iVar3;
  bool bVar4;
  int x;
  Queue_t queue;
  
  guts::BinomialQueue<int>::BinomialQueue(&queue);
  iVar3 = 100;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    uVar1 = rand32();
    x = uVar1 % 0x61;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,x);
    std::operator<<(poVar2,' ');
    guts::BinomialQueue<int>::push(&queue,&x);
  }
  guts::BinomialQueue<int>::decrease_key(&queue,0,0);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  while (queue.mHeight != 0) {
    iVar3 = guts::BinomialQueue<int>::pop(&queue);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::operator<<(poVar2,' ');
  }
  std::_Vector_base<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
  ::~_Vector_base(&queue.mNodes.
                   super__Vector_base<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
                 );
  return;
}

Assistant:

void testQueue()
{
    Queue_t queue;

    for (int i = 0; i != 100; ++i)
    {

        int x = rand32() % 97; 
        
        std::cout << x << ' ';

        queue.push(x);
    }

    queue.decrease_key(0, 0);

    std::cout << std::endl;

    while (!queue.empty())
    {
        int x = queue.pop();

        std::cout << x << ' ';
    }
}